

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdconnection.cc
# Opt level: O0

int __thiscall
bdConnectManager::cleanConnection
          (bdConnectManager *this,bdNodeId *srcId,bdNodeId *proxyId,bdNodeId *destId)

{
  bool bVar1;
  ostream *poVar2;
  _Self local_178;
  _Self local_170;
  iterator it;
  bdConnection conn;
  bdProxyTuple tuple;
  bdNodeId *destId_local;
  bdNodeId *proxyId_local;
  bdNodeId *srcId_local;
  bdConnectManager *this_local;
  
  bdProxyTuple::bdProxyTuple((bdProxyTuple *)((long)&conn.mCompletedTS + 4),srcId,proxyId,destId);
  bdConnection::bdConnection((bdConnection *)&it);
  local_170._M_node =
       (_Base_ptr)
       std::
       map<bdProxyTuple,_bdConnection,_std::less<bdProxyTuple>,_std::allocator<std::pair<const_bdProxyTuple,_bdConnection>_>_>
       ::find(&this->mConnections,(key_type *)((long)&conn.mCompletedTS + 4));
  local_178._M_node =
       (_Base_ptr)
       std::
       map<bdProxyTuple,_bdConnection,_std::less<bdProxyTuple>,_std::allocator<std::pair<const_bdProxyTuple,_bdConnection>_>_>
       ::end(&this->mConnections);
  bVar1 = std::operator==(&local_170,&local_178);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "bdConnectManager::cleanConnection() ERROR Removing: ");
    poVar2 = ::operator<<(poVar2,(bdProxyTuple *)((long)&conn.mCompletedTS + 4));
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::
    map<bdProxyTuple,bdConnection,std::less<bdProxyTuple>,std::allocator<std::pair<bdProxyTuple_const,bdConnection>>>
    ::erase_abi_cxx11_((map<bdProxyTuple,bdConnection,std::less<bdProxyTuple>,std::allocator<std::pair<bdProxyTuple_const,bdConnection>>>
                        *)&this->mConnections,(iterator)local_170._M_node);
  }
  this_local._4_4_ = (uint)!bVar1;
  return this_local._4_4_;
}

Assistant:

int bdConnectManager::cleanConnection(bdNodeId *srcId, bdNodeId *proxyId, bdNodeId *destId) {
	bdProxyTuple tuple(srcId, proxyId, destId);
	bdConnection conn;
#ifdef DEBUG_NODE_CONNECTION
	std::cerr << "bdConnectManager::cleanConnection() Removing: " << tuple << std::endl;
#endif
	std::map<bdProxyTuple, bdConnection>::iterator it = mConnections.find(tuple);
	if (it == mConnections.end()) {
		std::cerr << "bdConnectManager::cleanConnection() ERROR Removing: " << tuple << std::endl;
		return 0;
	}
	mConnections.erase(it);

	return 1;
}